

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.h
# Opt level: O0

SOccQuery * __thiscall
irr::video::CNullDriver::SOccQuery::operator=(SOccQuery *this,SOccQuery *other)

{
  undefined8 *in_RSI;
  SOccQuery *in_RDI;
  
  in_RDI->Node = (ISceneNode *)*in_RSI;
  in_RDI->Mesh = (IMesh *)in_RSI[1];
  in_RDI->field_2 = *(anon_union_8_2_439e2c06_for_SOccQuery_2 *)(in_RSI + 2);
  in_RDI->Result = *(u32 *)(in_RSI + 3);
  in_RDI->Run = *(u32 *)((long)in_RSI + 0x1c);
  if (in_RDI->Node != (ISceneNode *)0x0) {
    IReferenceCounted::grab
              ((IReferenceCounted *)
               (in_RDI->Node->_vptr_ISceneNode[-3] + -0x30 +
               (long)(in_RDI->Node->AbsoluteTransformation).M));
  }
  if (in_RDI->Mesh != (IMesh *)0x0) {
    IReferenceCounted::grab
              ((IReferenceCounted *)
               ((long)&in_RDI->Mesh->_vptr_IMesh + (long)in_RDI->Mesh->_vptr_IMesh[-3]));
  }
  return in_RDI;
}

Assistant:

SOccQuery &operator=(const SOccQuery &other)
		{
			Node = other.Node;
			Mesh = other.Mesh;
			PID = other.PID;
			Result = other.Result;
			Run = other.Run;
			if (Node)
				Node->grab();
			if (Mesh)
				Mesh->grab();
			return *this;
		}